

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

double duckdb::ApproxQuantileCoding::Encode<long,double>(long *input)

{
  duckdb *this;
  bool bVar1;
  undefined1 auVar2 [16];
  double result;
  double local_40;
  string local_38;
  
  this = (duckdb *)*input;
  bVar1 = TryCast::Operation<long,double>((int64_t)this,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,double>(&local_38,this,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static SAVE_TYPE Encode(const INPUT_TYPE &input) {
		return Cast::template Operation<INPUT_TYPE, SAVE_TYPE>(input);
	}